

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

JavascriptString * Js::JavascriptNumber::ToStringRadix10(double value,ScriptContext *scriptContext)

{
  BOOL BVar1;
  JavascriptString *str;
  OLECHAR local_a28 [4];
  char16 szBuffer [1280];
  
  str = ToStringNanOrInfiniteOrZero(value,scriptContext);
  if ((str == (JavascriptString *)0x0) &&
     (str = ScriptContext::GetLastNumberToStringRadix10(scriptContext,value),
     str == (JavascriptString *)0x0)) {
    BVar1 = NumberUtilities::FNonZeroFiniteDblToStr(value,local_a28,0x500);
    if (BVar1 == 0) {
      JavascriptError::ThrowOutOfMemoryError(scriptContext);
    }
    str = JavascriptString::NewCopySz(local_a28,scriptContext);
    ScriptContext::SetLastNumberToStringRadix10(scriptContext,value,str);
  }
  return str;
}

Assistant:

JavascriptString* JavascriptNumber::ToStringRadix10(double value, ScriptContext* scriptContext)
    {
        JavascriptString* string = ToStringNanOrInfiniteOrZero(value, scriptContext);
        if (string != nullptr)
        {
            return string;
        }

        string = scriptContext->GetLastNumberToStringRadix10(value);
        if (string == nullptr)
        {
            char16 szBuffer[bufSize];

            if(!Js::NumberUtilities::FNonZeroFiniteDblToStr(value, szBuffer, bufSize))
            {
                Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
            }
            string = JavascriptString::NewCopySz(szBuffer, scriptContext);
            scriptContext->SetLastNumberToStringRadix10(value, string);
        }
        return string;
    }